

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_reader_file_stat
                  (mz_zip_archive *pZip,mz_uint file_index,mz_zip_archive_file_stat *pStat)

{
  mz_zip_internal_state *pmVar1;
  mz_bool mVar2;
  mz_uint8 *pCentral_dir_header;
  
  if (((pZip == (mz_zip_archive *)0x0) ||
      (pmVar1 = pZip->m_pState, pmVar1 == (mz_zip_internal_state *)0x0)) ||
     (pZip->m_total_files <= file_index)) {
    pCentral_dir_header = (mz_uint8 *)0x0;
  }
  else {
    pCentral_dir_header =
         (mz_uint8 *)
         ((ulong)*(uint *)((long)(pmVar1->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
         (long)(pmVar1->m_central_dir).m_p);
  }
  mVar2 = mz_zip_file_stat_internal(pZip,file_index,pCentral_dir_header,pStat,(mz_bool *)0x0);
  return mVar2;
}

Assistant:

mz_bool mz_zip_reader_file_stat(mz_zip_archive *pZip, mz_uint file_index,
                                mz_zip_archive_file_stat *pStat) {
  return mz_zip_file_stat_internal(
      pZip, file_index, mz_zip_get_cdh(pZip, file_index), pStat, NULL);
}